

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

_Bool chck_buffer_read_string(char **str,size_t *len,chck_buffer *buf)

{
  _Bool _Var1;
  byte local_29;
  chck_buffer *pcStack_28;
  uint8_t bits;
  chck_buffer *buf_local;
  size_t *len_local;
  char **str_local;
  
  pcStack_28 = buf;
  buf_local = (chck_buffer *)len;
  len_local = (size_t *)str;
  if ((str != (char **)0x0) && (buf != (chck_buffer *)0x0)) {
    *str = (char *)0x0;
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    _Var1 = chck_buffer_read_int(&local_29,CHCK_BUFFER_B8,buf);
    if (((_Var1 ^ 0xffU) & 1) == 0) {
      str_local._7_1_ =
           chck_buffer_read_string_of_type
                     ((char **)len_local,(size_t *)buf_local,(uint)local_29,pcStack_28);
    }
    else {
      str_local._7_1_ = false;
    }
    return str_local._7_1_;
  }
  __assert_fail("str && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x151,"_Bool chck_buffer_read_string(char **, size_t *, struct chck_buffer *)");
}

Assistant:

bool
chck_buffer_read_string(char **str, size_t *len, struct chck_buffer *buf)
{
   assert(str && buf);
   *str = NULL;

   if (len)
      *len = 0;

   uint8_t bits;
   if (unlikely(!chck_buffer_read_int(&bits, sizeof(bits), buf)))
      return false;

   return likely(chck_buffer_read_string_of_type(str, len, bits, buf));
}